

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

int set_file_offset(stb_vorbis *f,uint loc)

{
  uint uVar1;
  int iVar2;
  uint8 *in_RAX;
  ulong __off;
  
  if (f->push_mode == '\0') {
    f->eof = 0;
    if (f->stream == (uint8 *)0x0) {
      if ((int)loc < 0 || CARRY4(f->f_start,loc)) {
        f->eof = 1;
        __off = 0x7fffffff;
      }
      else {
        __off = (ulong)(f->f_start + loc);
      }
      uVar1 = fseek((FILE *)f->f,__off,0);
      in_RAX = (uint8 *)(ulong)uVar1;
      if (uVar1 != 0) {
        f->eof = 1;
        iVar2 = fseek((FILE *)f->f,(ulong)f->f_start,2);
        return iVar2;
      }
    }
    else {
      in_RAX = f->stream_start + loc;
      if (in_RAX < f->stream_end) {
        f->stream = in_RAX;
      }
      else {
        f->stream = f->stream_end;
        f->eof = 1;
      }
    }
  }
  return (int)in_RAX;
}

Assistant:

static int set_file_offset(stb_vorbis *f, unsigned int loc)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   f->eof = 0;
   if (USE_MEMORY(f)) {
      if (f->stream_start + loc >= f->stream_end || f->stream_start + loc < f->stream_start) {
         f->stream = f->stream_end;
         f->eof = 1;
         return 0;
      } else {
         f->stream = f->stream_start + loc;
         return 1;
      }
   }
   #ifndef STB_VORBIS_NO_STDIO
   if (loc + f->f_start < loc || loc >= 0x80000000) {
      loc = 0x7fffffff;
      f->eof = 1;
   } else {
      loc += f->f_start;
   }
   if (!fseek(f->f, loc, SEEK_SET))
      return 1;
   f->eof = 1;
   fseek(f->f, f->f_start, SEEK_END);
   return 0;
   #endif
}